

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O3

int run_test_tty_pty(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int slave_fd;
  int master_fd;
  winsize w;
  uv_tty_t slave_tty;
  uv_tty_t master_tty;
  uv_loop_t loop;
  uint local_5e0;
  uint local_5dc;
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [312];
  undefined1 local_498 [1160];
  
  puVar2 = (uv_loop_t *)(local_498 + 0x138);
  iVar1 = uv_loop_init(puVar2);
  if (iVar1 == 0) {
    iVar1 = openpty(&local_5dc,&local_5e0,0,0,local_5d8);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return 1;
    }
    puVar2 = (uv_loop_t *)(local_498 + 0x138);
    iVar1 = uv_tty_init(puVar2,(uv_tty_t *)local_5d0,local_5e0,0);
    if (iVar1 != 0) goto LAB_00175e08;
    puVar2 = (uv_loop_t *)(local_498 + 0x138);
    iVar1 = uv_tty_init(puVar2,(uv_tty_t *)local_498,local_5dc,0);
    if (iVar1 != 0) goto LAB_00175e0d;
    puVar2 = (uv_loop_t *)local_5d0;
    iVar1 = uv_is_readable((uv_stream_t *)puVar2);
    if (iVar1 == 0) goto LAB_00175e12;
    puVar2 = (uv_loop_t *)local_5d0;
    iVar1 = uv_is_writable((uv_stream_t *)puVar2);
    if (iVar1 == 0) goto LAB_00175e17;
    puVar2 = (uv_loop_t *)local_498;
    iVar1 = uv_is_readable((uv_stream_t *)puVar2);
    if (iVar1 == 0) goto LAB_00175e1c;
    puVar2 = (uv_loop_t *)local_498;
    iVar1 = uv_is_writable((uv_stream_t *)puVar2);
    if (iVar1 == 0) goto LAB_00175e21;
    if ((local_5d0[0x5a] & 0x10) != 0) goto LAB_00175e26;
    if ((local_498[0x5a] & 0x10) == 0) goto LAB_00175e2b;
    puVar2 = (uv_loop_t *)(ulong)local_5e0;
    iVar1 = close(local_5e0);
    if (iVar1 != 0) goto LAB_00175e30;
    uv_close((uv_handle_t *)local_5d0,(uv_close_cb)0x0);
    puVar2 = (uv_loop_t *)(ulong)local_5dc;
    iVar1 = close(local_5dc);
    if (iVar1 != 0) goto LAB_00175e35;
    uv_close((uv_handle_t *)local_498,(uv_close_cb)0x0);
    puVar2 = (uv_loop_t *)(local_498 + 0x138);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00175e3f;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_00175e08:
    run_test_tty_pty_cold_3();
LAB_00175e0d:
    run_test_tty_pty_cold_4();
LAB_00175e12:
    run_test_tty_pty_cold_14();
LAB_00175e17:
    run_test_tty_pty_cold_13();
LAB_00175e1c:
    run_test_tty_pty_cold_12();
LAB_00175e21:
    run_test_tty_pty_cold_11();
LAB_00175e26:
    run_test_tty_pty_cold_5();
LAB_00175e2b:
    run_test_tty_pty_cold_10();
LAB_00175e30:
    run_test_tty_pty_cold_6();
LAB_00175e35:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_00175e3f:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tty_pty) {
#if defined(__APPLE__)                            || \
    defined(__DragonFly__)                        || \
    defined(__FreeBSD__)                          || \
    defined(__FreeBSD_kernel__)                   || \
    (defined(__linux__) && !defined(__ANDROID__)) || \
    defined(__NetBSD__)                           || \
    defined(__OpenBSD__)
  int master_fd, slave_fd, r;
  struct winsize w;
  uv_loop_t loop;
  uv_tty_t master_tty, slave_tty;

  ASSERT(0 == uv_loop_init(&loop));

  r = openpty(&master_fd, &slave_fd, NULL, NULL, &w);
  if (r != 0)
    RETURN_SKIP("No pty available, skipping.");

  ASSERT(0 == uv_tty_init(&loop, &slave_tty, slave_fd, 0));
  ASSERT(0 == uv_tty_init(&loop, &master_tty, master_fd, 0));
  ASSERT(uv_is_readable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &slave_tty));
  ASSERT(uv_is_readable((uv_stream_t*) &master_tty));
  ASSERT(uv_is_writable((uv_stream_t*) &master_tty));
  /* Check if the file descriptor was reopened. If it is,
   * UV_HANDLE_BLOCKING_WRITES (value 0x100000) isn't set on flags.
   */
  ASSERT(0 == (slave_tty.flags & 0x100000));
  /* The master_fd of a pty should never be reopened.
   */
  ASSERT(master_tty.flags & 0x100000);
  ASSERT(0 == close(slave_fd));
  uv_close((uv_handle_t*) &slave_tty, NULL);
  ASSERT(0 == close(master_fd));
  uv_close((uv_handle_t*) &master_tty, NULL);

  ASSERT(0 == uv_run(&loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
#endif
  return 0;
}